

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void parse_download(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e8;
  string local_3b0;
  Downloader local_389;
  reference pbStack_388;
  Downloader loader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_360 [8];
  string line;
  istream local_338 [8];
  fstream fin;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_124;
  undefined1 local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8 [32];
  iterator local_d8;
  size_type local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  undefined1 local_b0 [8];
  string file;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  iterator local_30;
  size_type local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  
  bVar1 = Args::has_help(&args,true,true,true);
  if (bVar1) {
    help_download();
  }
  else {
    file.field_2._M_local_buf[10] = '\x01';
    local_78 = &local_70;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"-r",&local_79);
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_50,"--requirement",(allocator<char> *)(file.field_2._M_local_buf + 0xb));
    file.field_2._M_local_buf[10] = '\0';
    local_30 = &local_70;
    local_28 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(file.field_2._M_local_buf + 9));
    __l_00._M_len = local_28;
    __l_00._M_array = local_30;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_20,__l_00,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(file.field_2._M_local_buf + 9));
    bVar1 = Args::has_option(&args,&local_20);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_20);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(file.field_2._M_local_buf + 9));
    local_3e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
    do {
      local_3e8 = local_3e8 + -1;
      std::__cxx11::string::~string((string *)local_3e8);
    } while (local_3e8 != &local_70);
    std::allocator<char>::~allocator((allocator<char> *)(file.field_2._M_local_buf + 0xb));
    std::allocator<char>::~allocator(&local_79);
    if (bVar1) {
      local_123 = 1;
      local_120 = &local_118;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"-r",&local_121);
      local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_f8,"--requirement",&local_122);
      local_123 = 0;
      local_d8 = &local_118;
      local_d0 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_124);
      __l._M_len = local_d0;
      __l._M_array = local_d8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_c8,__l,&local_124);
      Args::get_option_value((string *)local_b0,&args,&local_c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_124);
      local_428 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8;
      do {
        local_428 = local_428 + -1;
        std::__cxx11::string::~string((string *)local_428);
      } while (local_428 != &local_118);
      std::allocator<char>::~allocator(&local_122);
      std::allocator<char>::~allocator(&local_121);
      std::fstream::fstream(local_338,(string *)local_b0,_S_in);
      bVar2 = std::fstream::is_open();
      if ((bVar2 & 1) == 0) {
        line.field_2._M_local_buf[0xf] = ispring::xout[0x34];
        poVar3 = operator<<((ostream *)&std::cout,ispring::xout[0x34]);
        poVar3 = std::operator<<(poVar3,"ERROR: Could not open requirements file: ");
        poVar3 = std::operator<<(poVar3,(string *)local_b0);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
        std::__cxx11::string::string((string *)local_360);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  (local_338,(string *)local_360);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&args.packages,(value_type *)local_360);
        }
        std::__cxx11::string::~string((string *)local_360);
      }
      std::fstream::close();
      std::fstream::~fstream(local_338);
      std::__cxx11::string::~string((string *)local_b0);
    }
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&args.packages);
    p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&args.packages);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&p), bVar1) {
      pbStack_388 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2);
      std::__cxx11::string::string((string *)&local_3b0,(string *)pbStack_388);
      Downloader::Find(&local_389,&local_3b0,true);
      std::__cxx11::string::~string((string *)&local_3b0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void parse_download(){
    if(args.has_help()){
        help_download();
    }else{
        if(args.has_option({"-r","--requirement"})){
            std::string file=args.get_option_value({"-r","--requirement"});
            std::fstream fin(file,std::ios::in);
            if(fin.is_open()==false){
                std::cout << ispring::xout.red << "ERROR: Could not open requirements file: " << file << std::endl;
                exit(1);
            }
            while(!fin.eof()){
                std::string line;
                std::getline(fin,line);
                if(line.empty())continue;
                args.packages.push_back(line);
            }
            fin.close();
        }
        for(auto&p:args.packages){
            Downloader loader;
            loader.Find(p,true);
        }
    }
}